

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

void __thiscall
dap::BreakpointLocationsRequest::BreakpointLocationsRequest(BreakpointLocationsRequest *this)

{
  (this->column).val.val = 0;
  (this->column).set = false;
  (this->endColumn).val.val = 0;
  (this->endColumn).set = false;
  (this->endLine).val.val = 0;
  (this->endLine).set = false;
  (this->line).val = 0;
  Source::Source(&this->source);
  return;
}

Assistant:

inline integer() : val(0) {}